

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

XXH_NAMESPACEXXH_errorcode
XXH_INLINE_XXH64_update(XXH_NAMESPACEXXH64_state_t *state,void *input,size_t len)

{
  XXH_NAMESPACEXXH_errorcode in_EAX;
  void *pvVar1;
  ulong uVar2;
  long *plVar3;
  XXH64_hash_t XVar4;
  long *plVar5;
  XXH64_hash_t XVar6;
  XXH64_hash_t XVar7;
  XXH64_hash_t XVar8;
  
  if (input != (void *)0x0) {
    state->total_len = state->total_len + len;
    uVar2 = (ulong)state->memsize;
    if (uVar2 + len < 0x20) {
      pvVar1 = memcpy((void *)((long)state->mem64 + uVar2),input,len);
      in_EAX = (XXH_NAMESPACEXXH_errorcode)pvVar1;
      uVar2 = (ulong)((int)len + state->memsize);
    }
    else {
      plVar5 = (long *)(len + (long)input);
      if (uVar2 != 0) {
        memcpy((void *)((long)state->mem64 + uVar2),input,(ulong)(0x20 - state->memsize));
        uVar2 = state->mem64[0] * -0x3d4d51c2d82b14b1 + state->v[0];
        state->v[0] = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        uVar2 = state->mem64[1] * -0x3d4d51c2d82b14b1 + state->v[1];
        state->v[1] = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        uVar2 = state->mem64[2] * -0x3d4d51c2d82b14b1 + state->v[2];
        state->v[2] = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        uVar2 = state->mem64[3] * -0x3d4d51c2d82b14b1 + state->v[3];
        state->v[3] = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        input = (void *)((long)input + (ulong)(0x20 - state->memsize));
        state->memsize = 0;
      }
      plVar3 = (long *)((long)input + 0x20);
      if (plVar3 <= plVar5) {
        plVar3 = plVar5 + -4;
        XVar4 = state->v[0];
        XVar7 = state->v[1];
        XVar8 = state->v[2];
        XVar6 = state->v[3];
        do {
          uVar2 = *input * -0x3d4d51c2d82b14b1 + XVar4;
          XVar4 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
          state->v[0] = XVar4;
          uVar2 = *(long *)((long)input + 8) * -0x3d4d51c2d82b14b1 + XVar7;
          XVar7 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
          state->v[1] = XVar7;
          uVar2 = *(long *)((long)input + 0x10) * -0x3d4d51c2d82b14b1 + XVar8;
          XVar8 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
          state->v[2] = XVar8;
          uVar2 = *(long *)((long)input + 0x18) * -0x3d4d51c2d82b14b1 + XVar6;
          XVar6 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
          state->v[3] = XVar6;
          input = (void *)((long)input + 0x20);
        } while (input <= plVar3);
      }
      if (plVar5 <= input) {
        return (XXH_NAMESPACEXXH_errorcode)plVar3;
      }
      uVar2 = (long)plVar5 - (long)input;
      pvVar1 = memcpy(state->mem64,input,uVar2);
      in_EAX = (XXH_NAMESPACEXXH_errorcode)pvVar1;
    }
    state->memsize = (XXH32_hash_t)uVar2;
  }
  return in_EAX;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode
XXH64_update (XXH64_state_t* state, const void* input, size_t len)
{
    if (input==NULL) {
        XXH_ASSERT(len == 0);
        return XXH_OK;
    }

    {   const xxh_u8* p = (const xxh_u8*)input;
        const xxh_u8* const bEnd = p + len;

        state->total_len += len;

        if (state->memsize + len < 32) {  /* fill in tmp buffer */
            XXH_memcpy(((xxh_u8*)state->mem64) + state->memsize, input, len);
            state->memsize += (xxh_u32)len;
            return XXH_OK;
        }

        if (state->memsize) {   /* tmp buffer is full */
            XXH_memcpy(((xxh_u8*)state->mem64) + state->memsize, input, 32-state->memsize);
            state->v[0] = XXH64_round(state->v[0], XXH_readLE64(state->mem64+0));
            state->v[1] = XXH64_round(state->v[1], XXH_readLE64(state->mem64+1));
            state->v[2] = XXH64_round(state->v[2], XXH_readLE64(state->mem64+2));
            state->v[3] = XXH64_round(state->v[3], XXH_readLE64(state->mem64+3));
            p += 32 - state->memsize;
            state->memsize = 0;
        }

        if (p+32 <= bEnd) {
            const xxh_u8* const limit = bEnd - 32;

            do {
                state->v[0] = XXH64_round(state->v[0], XXH_readLE64(p)); p+=8;
                state->v[1] = XXH64_round(state->v[1], XXH_readLE64(p)); p+=8;
                state->v[2] = XXH64_round(state->v[2], XXH_readLE64(p)); p+=8;
                state->v[3] = XXH64_round(state->v[3], XXH_readLE64(p)); p+=8;
            } while (p<=limit);

        }

        if (p < bEnd) {
            XXH_memcpy(state->mem64, p, (size_t)(bEnd-p));
            state->memsize = (unsigned)(bEnd-p);
        }
    }

    return XXH_OK;
}